

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

string * __thiscall
duckdb::StringUtil::Format<std::__cxx11::string,int,int,int>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,int params_1,
          int params_2,int params_3)

{
  int in_stack_ffffffffffffffa8;
  string local_50;
  
  ::std::__cxx11::string::string((string *)&local_50,(string *)fmt_str);
  Exception::ConstructMessage<std::__cxx11::string,int,int,int>
            (__return_storage_ptr__,(Exception *)this,&local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)params & 0xffffffff),params_1,params_2,in_stack_ffffffffffffffa8);
  ::std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}